

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

void QUtil::analyze_encoding(string *val,bool *has_8bit_chars,bool *is_valid_utf8,bool *is_utf16)

{
  ulong uVar1;
  char *pcVar2;
  size_t sVar3;
  byte bVar4;
  char cVar5;
  bool error;
  size_t pos;
  bool local_49;
  bool *local_48;
  size_t local_40;
  bool *local_38;
  
  *is_valid_utf8 = false;
  *is_utf16 = false;
  *has_8bit_chars = false;
  uVar1 = val->_M_string_length;
  if (uVar1 < 2) {
    if (uVar1 == 0) {
      return;
    }
  }
  else {
    pcVar2 = (val->_M_dataplus)._M_p;
    cVar5 = *pcVar2;
    if (cVar5 == -2) {
      cVar5 = -1;
    }
    else {
      if (cVar5 != -1) goto LAB_00244160;
      cVar5 = -2;
    }
    if (pcVar2[1] == cVar5) {
      *has_8bit_chars = true;
      *is_utf16 = true;
      return;
    }
  }
LAB_00244160:
  local_40 = 0;
  bVar4 = 0;
  local_48 = has_8bit_chars;
  local_38 = is_valid_utf8;
  do {
    sVar3 = local_40;
    local_49 = false;
    get_next_utf8_codepoint(val,&local_40,&local_49);
    if ((1 < local_40 - sVar3) || ((val->_M_dataplus)._M_p[sVar3] < '\0')) {
      *local_48 = true;
    }
    bVar4 = bVar4 | local_49;
  } while (local_40 < uVar1);
  if (((~*local_48 | bVar4) & 1) == 0) {
    *local_38 = true;
  }
  return;
}

Assistant:

void
QUtil::analyze_encoding(
    std::string const& val, bool& has_8bit_chars, bool& is_valid_utf8, bool& is_utf16)
{
    has_8bit_chars = is_utf16 = is_valid_utf8 = false;
    if (QUtil::is_utf16(val)) {
        has_8bit_chars = true;
        is_utf16 = true;
        return;
    }
    size_t len = val.length();
    size_t pos = 0;
    bool any_errors = false;
    while (pos < len) {
        bool error = false;
        auto o_pos = pos;
        get_next_utf8_codepoint(val, pos, error);
        if (error) {
            any_errors = true;
        }
        if (pos - o_pos > 1 || val[o_pos] & 0x80) {
            has_8bit_chars = true;
        }
    }
    if (has_8bit_chars && (!any_errors)) {
        is_valid_utf8 = true;
    }
}